

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_keygen.c
# Opt level: O3

int ulp_ring_generate_key_pair
              (size_t n,uint64_t sk,uint64_t se,uint64_t q,ulp_ring_public_key **pub_key_p,
              ulp_ring_private_key **priv_key_p)

{
  uint64_t *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulp_ring_public_key *pub_key;
  ulp_ring_private_key *priv_key;
  uint64_t *result;
  size_t sVar5;
  
  iVar3 = -2;
  iVar2 = -2;
  if (((((-1 < (long)q) && (iVar2 = iVar3, n != 0)) && (sk != 0)) && ((se != 0 && (q != 0)))) &&
     ((pub_key_p != (ulp_ring_public_key **)0x0 && (priv_key_p != (ulp_ring_private_key **)0x0)))) {
    pub_key = ulp_ring_alloc_public_key(n);
    priv_key = ulp_ring_alloc_private_key(n);
    result = (uint64_t *)malloc(n * 8);
    if (result != (uint64_t *)0x0 &&
        (priv_key != (ulp_ring_private_key *)0x0 && pub_key != (ulp_ring_public_key *)0x0)) {
      pub_key->se = se;
      pub_key->q = q;
      priv_key->q = q;
      iVar2 = get_random_numbers(pub_key->a,n,q);
      iVar3 = get_random_numbers(pub_key->p,n,sk);
      iVar4 = get_random_numbers(priv_key->s,n,sk);
      if ((iVar4 + iVar3 + iVar2 == 0) &&
         (iVar2 = poly_mulmod(priv_key->s,pub_key->a,n,q,result), iVar2 == 0)) {
        puVar1 = pub_key->p;
        sVar5 = 0;
        do {
          puVar1[sVar5] = ((puVar1[sVar5] + q) - result[sVar5]) % q;
          sVar5 = sVar5 + 1;
        } while (n != sVar5);
        free(result);
        *pub_key_p = pub_key;
        *priv_key_p = priv_key;
        return 0;
      }
    }
    ulp_ring_free_public_key(pub_key);
    ulp_ring_free_private_key(priv_key);
    free(result);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int ulp_ring_generate_key_pair(size_t n, uint64_t sk, uint64_t se, uint64_t q, ulp_ring_public_key** pub_key_p, ulp_ring_private_key** priv_key_p) {

    if(n == 0 || sk == 0 || se == 0 || q == 0 || pub_key_p == NULL || priv_key_p == NULL || q >= 0x8000000000000000)
        return -2;

    // allocate memory for keys
    ulp_ring_public_key* pub_key = ulp_ring_alloc_public_key(n);
    ulp_ring_private_key* priv_key = ulp_ring_alloc_private_key(n);
    uint64_t* sa = malloc(n*sizeof(uint64_t));
    if(pub_key == NULL || priv_key == NULL || sa == NULL)
        goto fail;

    // store parameters in key structs
    pub_key->se = se;
    pub_key->q = q;
    priv_key->q = q;

    // sample random data
    int err = 0;
    err += get_random_numbers(pub_key->a, n, q);
    err += get_random_numbers(pub_key->p, n, sk);
    err += get_random_numbers(priv_key->s, n, sk);
    if(err != 0)
        goto fail;

    // s*a
    if(poly_mulmod(priv_key->s, pub_key->a, n, q, sa) != 0)
        goto fail;

    // p = e - s*a
    for(size_t i = 0; i < n; i++) {
        pub_key->p[i] = (pub_key->p[i] + q - sa[i]) % q;
    }

    // exit properly
    free(sa);
    *pub_key_p = pub_key;
    *priv_key_p = priv_key;
    return 0;


    // on failure, do cleanup
    fail:
        ulp_ring_free_public_key(pub_key);
        ulp_ring_free_private_key(priv_key);
        free(sa);
        return -1;

}